

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::UpdateEntryPointsOnDebugReparse(FunctionBody *this)

{
  anon_class_24_3_558ab67d func;
  anon_class_24_3_558ab67d updateOneType;
  ProxyEntryPointInfo *pPStack_20;
  bool isAsmJS;
  JavascriptMethod newEntryPoint;
  ProxyEntryPointInfo *entryPointInfo;
  FunctionBody *this_local;
  
  entryPointInfo = (ProxyEntryPointInfo *)this;
  newEntryPoint = (JavascriptMethod)GetDefaultFunctionEntryPointInfo(this);
  pPStack_20 = (ProxyEntryPointInfo *)
               FunctionProxy::GetDirectEntryPoint
                         ((FunctionProxy *)this,(ProxyEntryPointInfo *)newEntryPoint);
  updateOneType.isAsmJS._7_1_ =
       ParseableFunctionInfo::GetIsAsmjsMode(&this->super_ParseableFunctionInfo);
  updateOneType.entryPointInfo = &stack0xffffffffffffffe0;
  updateOneType.newEntryPoint = (JavascriptMethod *)((long)&updateOneType.isAsmJS + 7);
  func.newEntryPoint = (JavascriptMethod *)updateOneType.entryPointInfo;
  func.entryPointInfo = (ProxyEntryPointInfo **)&newEntryPoint;
  func.isAsmJS = (bool *)updateOneType.newEntryPoint;
  FunctionProxy::MapFunctionObjectTypes<Js::FunctionBody::UpdateEntryPointsOnDebugReparse()::__0>
            ((FunctionProxy *)this,func);
  return;
}

Assistant:

void FunctionBody::UpdateEntryPointsOnDebugReparse()
    {
        // Update all function types associated with this function body. Note that we can't rely on updating
        // types pointed to by function objects, because the type may evolve to one that is not currently referenced.

        ProxyEntryPointInfo * entryPointInfo = this->GetDefaultFunctionEntryPointInfo();
        JavascriptMethod newEntryPoint = this->GetDirectEntryPoint(entryPointInfo);
        bool isAsmJS = this->GetIsAsmjsMode();

        auto updateOneType = [&](ScriptFunctionType* functionType) {
            // Note that the ScriptFunctionType method will handle cross-site thunks correctly.
            functionType->ChangeEntryPoint(entryPointInfo, newEntryPoint, isAsmJS);
        };

        this->MapFunctionObjectTypes(updateOneType);
    }